

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

column<Position> * __thiscall
flecs::iter::get_column<Position>
          (column<Position> *__return_storage_ptr__,iter *this,int32_t column_id)

{
  _Bool _Var1;
  ecs_entity_t eVar2;
  entity_t eVar3;
  Position *array;
  bool bVar4;
  _Bool local_2a;
  size_t sStack_28;
  bool is_shared;
  size_t count;
  ecs_entity_t column_entity;
  int32_t column_id_local;
  iter *this_local;
  
  eVar2 = ecs_column_entity(this->m_iter,column_id);
  local_2a = true;
  if ((((eVar2 & 0xfa00000000000000) == 0) && (local_2a = true, (eVar2 & 0xfb00000000000000) == 0))
     && (local_2a = true, (eVar2 & 0xfc00000000000000) == 0)) {
    eVar3 = _::component_info<Position>::id(this->m_iter->world,(char *)0x0,true);
    local_2a = eVar2 == eVar3;
  }
  _ecs_assert(local_2a,0x17,(char *)0x0,
              "column_entity & ECS_TRAIT || column_entity & ECS_SWITCH || column_entity & ECS_CASE || column_entity == _::component_info<T>::id(m_iter->world)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0x285);
  bVar4 = true;
  if ((((eVar2 & 0xfa00000000000000) == 0) && (bVar4 = true, (eVar2 & 0xfb00000000000000) == 0)) &&
     (bVar4 = true, (eVar2 & 0xfc00000000000000) == 0)) {
    eVar3 = _::component_info<Position>::id(this->m_iter->world,(char *)0x0,true);
    bVar4 = eVar2 == eVar3;
  }
  if (!bVar4) {
    __assert_fail("column_entity & (((uint64_t)1 << 63) | ((ecs_entity_t)0x7A << 56)) || column_entity & (((uint64_t)1 << 63) | ((ecs_entity_t)0x7B << 56)) || column_entity & (((uint64_t)1 << 63) | ((ecs_entity_t)0x7C << 56)) || column_entity == _::component_info<T>::id(m_iter->world)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0x285,"flecs::column<T> flecs::iter::get_column(int32_t) const [T = Position]");
  }
  _Var1 = ecs_is_owned(this->m_iter,column_id);
  bVar4 = (bool)((_Var1 ^ 0xffU) & 1);
  if (bVar4 == false) {
    sStack_28 = (size_t)this->m_iter->count;
  }
  else {
    sStack_28 = 1;
  }
  array = (Position *)ecs_column_w_size(this->m_iter,8,column_id);
  column<Position>::column(__return_storage_ptr__,array,sStack_28,bVar4);
  return __return_storage_ptr__;
}

Assistant:

flecs::column<T> get_column(int32_t column_id) const {
#ifndef NDEBUG
        ecs_entity_t column_entity = ecs_column_entity(m_iter, column_id);
        ecs_assert(column_entity & ECS_TRAIT || column_entity & ECS_SWITCH || 
            column_entity & ECS_CASE ||
            column_entity == _::component_info<T>::id(m_iter->world), 
            ECS_COLUMN_TYPE_MISMATCH, NULL);
#endif

        size_t count;
        bool is_shared = !ecs_is_owned(m_iter, column_id);

        /* If a shared column is retrieved with 'column', there will only be a
         * single value. Ensure that the application does not accidentally read
         * out of bounds. */
        if (is_shared) {
            count = 1;
        } else {
            /* If column is owned, there will be as many values as there are
             * entities. */
            count = static_cast<size_t>(m_iter->count);
        }
        
        return flecs::column<T>(
            static_cast<T*>(ecs_column_w_size(m_iter, sizeof(T), column_id)), 
            count, is_shared);
    }